

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatasetBuilder.cpp
# Opt level: O1

FileId __thiscall DatasetBuilder::register_fname(DatasetBuilder *this,string *fname)

{
  pointer pbVar1;
  pointer pbVar2;
  long lVar3;
  runtime_error *this_00;
  
  lVar3 = std::__cxx11::string::find((char)fname,10);
  if (lVar3 == -1) {
    lVar3 = std::__cxx11::string::find((char)fname,0xd);
    if (lVar3 == -1) {
      pbVar1 = (this->fids).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar2 = (this->fids).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->fids,fname);
      return (FileId)((ulong)((long)pbVar1 - (long)pbVar2) >> 5);
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"file name contains invalid character (either \\r or \\n)");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FileId DatasetBuilder::register_fname(const std::string &fname) {
    if (fname.find('\n') != std::string::npos ||
        fname.find('\r') != std::string::npos) {
        throw std::runtime_error(
            "file name contains invalid character (either \\r or \\n)");
    }

    auto new_id = static_cast<FileId>(fids.size());
    fids.push_back(fname);
    return new_id;
}